

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite_inl.h
# Opt level: O0

uint8 * google::protobuf::internal::WireFormatLite::WriteFixedNoTagToArray<double>
                  (RepeatedField<double> *value,_func_uint8_ptr_double_uint8_ptr *Writer,
                  uint8 *target)

{
  int iVar1;
  LogMessage *other;
  double *__src;
  int bytes;
  double *ii;
  byte local_61;
  LogMessage local_60;
  int local_24;
  uint8 *puStack_20;
  int n;
  uint8 *target_local;
  _func_uint8_ptr_double_uint8_ptr *Writer_local;
  RepeatedField<double> *value_local;
  
  puStack_20 = target;
  target_local = (uint8 *)Writer;
  Writer_local = (_func_uint8_ptr_double_uint8_ptr *)value;
  local_24 = RepeatedField<double>::size(value);
  local_61 = 0;
  if (local_24 < 1) {
    LogMessage::LogMessage
              (&local_60,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/wire_format_lite_inl.h"
               ,0x2b7);
    local_61 = 1;
    other = LogMessage::operator<<(&local_60,"CHECK failed: (n) > (0): ");
    LogFinisher::operator=((LogFinisher *)((long)&ii + 3),other);
  }
  if ((local_61 & 1) != 0) {
    LogMessage::~LogMessage(&local_60);
  }
  __src = RepeatedField<double>::unsafe_data((RepeatedField<double> *)Writer_local);
  iVar1 = local_24 << 3;
  memcpy(puStack_20,__src,(long)iVar1);
  return puStack_20 + iVar1;
}

Assistant:

inline uint8* WireFormatLite::WriteFixedNoTagToArray(
      const RepeatedField<T>& value,
      uint8* (*Writer)(T, uint8*), uint8* target) {
#if defined(PROTOBUF_LITTLE_ENDIAN)
  (void) Writer;

  const int n = value.size();
  GOOGLE_DCHECK_GT(n, 0);

  const T* ii = value.unsafe_data();
  const int bytes = n * sizeof(ii[0]);
  memcpy(target, ii, bytes);
  return target + bytes;
#else
  return WritePrimitiveNoTagToArray(value, Writer, target);
#endif
}